

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cc
# Opt level: O2

void __thiscall leveldb::Block::Block(Block *this,BlockContents *contents)

{
  long lVar1;
  ulong uVar2;
  size_t sVar3;
  uint32_t uVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this->data_ = (contents->data).data_;
  uVar2 = (contents->data).size_;
  this->size_ = uVar2;
  this->owned_ = contents->heap_allocated;
  if (3 < uVar2) {
    uVar4 = NumRestarts(this);
    if ((ulong)uVar4 <= uVar2 - 4 >> 2) {
      sVar3 = this->size_;
      uVar4 = NumRestarts(this);
      this->restart_offset_ = (uVar4 * -4 + (int)sVar3) - 4;
      goto LAB_0055f262;
    }
  }
  this->size_ = 0;
LAB_0055f262:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Block::Block(const BlockContents& contents)
    : data_(contents.data.data()),
      size_(contents.data.size()),
      owned_(contents.heap_allocated) {
  if (size_ < sizeof(uint32_t)) {
    size_ = 0;  // Error marker
  } else {
    size_t max_restarts_allowed = (size_ - sizeof(uint32_t)) / sizeof(uint32_t);
    if (NumRestarts() > max_restarts_allowed) {
      // The size is too small for NumRestarts()
      size_ = 0;
    } else {
      restart_offset_ = size_ - (1 + NumRestarts()) * sizeof(uint32_t);
    }
  }
}